

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_random.c
# Opt level: O2

void arc4_stir(void)

{
  uint8_t uVar1;
  int n;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  uint uVar5;
  bool bVar6;
  anon_struct_152_3_0413aac1 rdat;
  timeval tStack_a8;
  __pid_t local_98;
  
  if (rs_initialized == '\0') {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      rs.s[lVar3] = (uint8_t)lVar3;
    }
    rs.i = '\0';
    rs.j = '\0';
    rs_initialized = '\x01';
  }
  iVar2 = open("/dev/urandom",0x80000,0);
  if (-1 < iVar2) {
    sVar4 = read(iVar2,&tStack_a8,0x80);
    close(iVar2);
    if (sVar4 == 0x80) goto LAB_0016ceab;
  }
  gettimeofday(&tStack_a8,(__timezone_ptr_t)0x0);
  local_98 = getpid();
LAB_0016ceab:
  for (uVar5 = 0; uVar5 != 0x100; uVar5 = uVar5 + 1) {
    uVar1 = rs.s[rs.i];
    rs.j = rs.j + uVar1 + *(char *)((long)&tStack_a8.tv_sec + (ulong)(uVar5 & 0x7f));
    rs.s[rs.i] = rs.s[rs.j];
    rs.s[rs.j] = uVar1;
    rs.i = rs.i + 1;
  }
  rs.j = rs.i - 1;
  rs.i = rs.i - 1;
  iVar2 = 0xc00;
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    arc4_getbyte();
  }
  arc4_count = 1600000;
  return;
}

Assistant:

static void
arc4_stir(void)
{
	int done, fd, i;
	struct {
		struct timeval	tv;
		pid_t		pid;
		uint8_t		rnd[KEYSIZE];
	} rdat;

	if (!rs_initialized) {
		arc4_init();
		rs_initialized = 1;
	}
	done = 0;
	fd = open(RANDOMDEV, O_RDONLY | O_CLOEXEC, 0);
	if (fd >= 0) {
		if (read(fd, &rdat, KEYSIZE) == KEYSIZE)
			done = 1;
		(void)close(fd);
	}
	if (!done) {
		(void)gettimeofday(&rdat.tv, NULL);
		rdat.pid = getpid();
		/* We'll just take whatever was on the stack too... */
	}

	arc4_addrandom((uint8_t *)&rdat, KEYSIZE);

	/*
	 * Discard early keystream, as per recommendations in:
	 * "(Not So) Random Shuffles of RC4" by Ilya Mironov.
	 * As per the Network Operations Division, cryptographic requirements
	 * published on wikileaks on March 2017.
	 */

	for (i = 0; i < 3072; i++)
		(void)arc4_getbyte();
	arc4_count = 1600000;
}